

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# function.h
# Opt level: O1

void __thiscall
kj::Function<void_()>::
Impl<(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/threadlocal-test.c++:52:10)>
::operator()(Impl<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_Cosmic_Sans[P]capnproto_c___src_kj_threadlocal_test_c__:52:10)>
             *this)

{
  uint **ppuVar1;
  uint *puVar2;
  long in_FS_OFFSET;
  uint *local_18;
  
  *(this->f).p = *(uint **)(in_FS_OFFSET + -0x10);
  ppuVar1 = (this->f).p;
  if ((*ppuVar1 != (uint *)0x0) && (_::Debug::minSeverity < 3)) {
    local_18 = (uint *)0x0;
    _::Debug::log<char_const(&)[34],decltype(nullptr),unsigned_int*&>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/threadlocal-test.c++"
               ,0x36,ERROR,"\"failed: expected \" \"(nullptr) == (p)\", nullptr, p",
               (char (*) [34])"failed: expected (nullptr) == (p)",&local_18,ppuVar1);
  }
  puVar2 = (this->f).j;
  *(uint **)(in_FS_OFFSET + -0x10) = puVar2;
  *(this->f).p = puVar2;
  ppuVar1 = (this->f).p;
  local_18 = (this->f).j;
  if ((local_18 != *ppuVar1) && (_::Debug::minSeverity < 3)) {
    _::Debug::log<char_const(&)[29],unsigned_int*,unsigned_int*&>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/threadlocal-test.c++"
               ,0x3a,ERROR,"\"failed: expected \" \"(&j) == (p)\", &j, p",
               (char (*) [29])"failed: expected (&j) == (p)",&local_18,ppuVar1);
  }
  *(this->f).threadDone = true;
  return;
}

Assistant:

Return operator()(Params... params) override {
      return f(kj::fwd<Params>(params)...);
    }